

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O1

FT_Error T42_Size_Init(FT_Size size)

{
  FT_Error FVar1;
  FT_Face in_RAX;
  FT_Size ttsize;
  FT_Face local_18;
  
  local_18 = in_RAX;
  FVar1 = FT_New_Size((FT_Face)size->face[3].available_sizes,(FT_Size *)&local_18);
  if (FVar1 == 0) {
    size[1].face = local_18;
  }
  FT_Activate_Size((FT_Size)local_18);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Size_Init( FT_Size  size )         /* T42_Size */
  {
    T42_Size  t42size = (T42_Size)size;
    FT_Face   face    = size->face;
    T42_Face  t42face = (T42_Face)face;
    FT_Size   ttsize;
    FT_Error  error;


    error = FT_New_Size( t42face->ttf_face, &ttsize );
    if ( !error )
      t42size->ttsize = ttsize;

    FT_Activate_Size( ttsize );

    return error;
  }